

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

cram_codec *
cram_byte_array_stop_decode_init(char *data,int size,cram_external_type option,int version)

{
  byte bVar1;
  cram_codec *__ptr;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  code *pcVar5;
  long lStack_30;
  
  __ptr = (cram_codec *)malloc(0x240);
  if (__ptr != (cram_codec *)0x0) {
    pcVar5 = cram_byte_array_stop_decode_char;
    if (option == E_BYTE_ARRAY_BLOCK) {
      pcVar5 = cram_byte_array_stop_decode_block;
    }
    __ptr->codec = E_BYTE_ARRAY_STOP;
    __ptr->decode = pcVar5;
    __ptr->free = cram_byte_array_stop_decode_free;
    (__ptr->field_6).byte_array_stop.stop = *data;
    if ((version & 0xffffff00U) == 0x100) {
      (__ptr->field_6).external.type = *(cram_external_type *)(data + 1);
      pbVar2 = (byte *)(data + 5);
    }
    else {
      bVar1 = data[1];
      uVar4 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        uVar3 = (uint)bVar1;
        uVar4 = (uint)(byte)data[2];
        if (bVar1 < 0xc0) {
          uVar4 = (uVar3 & 0x3f) << 8 | uVar4;
          lStack_30 = 2;
        }
        else if (bVar1 < 0xe0) {
          uVar4 = (uVar3 & 0x1f) << 0x10 | uVar4 << 8 | (uint)(byte)data[3];
          lStack_30 = 3;
        }
        else if (bVar1 < 0xf0) {
          uVar4 = (uVar3 & 0xf) << 0x18 | uVar4 << 0x10 | (uint)(byte)data[3] << 8 |
                  (uint)(byte)data[4];
          lStack_30 = 4;
        }
        else {
          uVar4 = (byte)data[5] & 0xf |
                  (uint)(byte)data[4] << 4 |
                  (uint)(byte)data[3] << 0xc | uVar4 << 0x14 | uVar3 << 0x1c;
          lStack_30 = 5;
        }
      }
      else {
        lStack_30 = 1;
      }
      *(uint *)((long)&__ptr->field_6 + 4) = uVar4;
      pbVar2 = (byte *)(data + 1 + lStack_30);
    }
    if ((long)pbVar2 - (long)data == (long)size) {
      return __ptr;
    }
    fwrite("Malformed byte_array_stop header stream\n",0x28,1,_stderr);
    free(__ptr);
  }
  return (cram_codec *)0x0;
}

Assistant:

cram_codec *cram_byte_array_stop_decode_init(char *data, int size,
					     enum cram_external_type option,
					     int version) {
    cram_codec *c;
    unsigned char *cp = (unsigned char *)data;

    if (!(c = malloc(sizeof(*c))))
	return NULL;

    c->codec  = E_BYTE_ARRAY_STOP;
    c->decode = (option == E_BYTE_ARRAY_BLOCK)
	? cram_byte_array_stop_decode_block
	: cram_byte_array_stop_decode_char;
    c->free   = cram_byte_array_stop_decode_free;
    
    c->byte_array_stop.stop = *cp++;
    if (CRAM_MAJOR_VERS(version) == 1) {
	c->byte_array_stop.content_id = cp[0] + (cp[1]<<8) + (cp[2]<<16)
	    + (cp[3]<<24);
	cp += 4;
    } else {
	cp += itf8_get(cp, &c->byte_array_stop.content_id);
    }

    if ((char *)cp - data != size) {
	fprintf(stderr, "Malformed byte_array_stop header stream\n");
	free(c);
	return NULL;
    }

    return c;
}